

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_IsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  int iVar1;
  JSValue JVar2;
  JSValueUnion local_28;
  int64_t local_20;
  
  local_20 = val.tag;
  local_28 = val.u;
  if ((int)obj.tag == -1) {
    JVar2 = JS_GetPropertyInternal(ctx,obj,0xce,obj,0);
    if (1 < (int)JVar2.tag - 2U) {
      if ((int)JVar2.tag == 6) {
        return -1;
      }
      JVar2 = JS_CallFree(ctx,JVar2,obj,1,(JSValue *)&local_28);
      iVar1 = JS_ToBoolFree(ctx,JVar2);
      return iVar1;
    }
    iVar1 = JS_IsFunction(ctx,obj);
    if (iVar1 != 0) {
      JVar2.tag = local_20;
      JVar2.u.float64 = local_28.float64;
      iVar1 = JS_OrdinaryIsInstanceOf(ctx,JVar2,obj);
      return iVar1;
    }
  }
  JS_ThrowTypeError(ctx,"invalid \'instanceof\' right operand");
  return -1;
}

Assistant:

int JS_IsInstanceOf(JSContext *ctx, JSValueConst val, JSValueConst obj)
{
    JSValue method;

    if (!JS_IsObject(obj))
        goto fail;
    method = JS_GetProperty(ctx, obj, JS_ATOM_Symbol_hasInstance);
    if (JS_IsException(method))
        return -1;
    if (!JS_IsNull(method) && !JS_IsUndefined(method)) {
        JSValue ret;
        ret = JS_CallFree(ctx, method, obj, 1, &val);
        return JS_ToBoolFree(ctx, ret);
    }

    /* legacy case */
    if (!JS_IsFunction(ctx, obj)) {
    fail:
        JS_ThrowTypeError(ctx, "invalid 'instanceof' right operand");
        return -1;
    }
    return JS_OrdinaryIsInstanceOf(ctx, val, obj);
}